

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dtptngen.cpp
# Opt level: O2

UDateTimePatternField __thiscall
icu_63::DateTimePatternGenerator::getFieldAndWidthIndices
          (DateTimePatternGenerator *this,char *key,UDateTimePGDisplayWidth *widthP)

{
  int iVar1;
  char *__s2;
  int *piVar2;
  int32_t i;
  long lVar3;
  long lVar4;
  char cldrFieldKey [25];
  
  strncpy(cldrFieldKey,key,0x18);
  cldrFieldKey[0x18] = '\0';
  *widthP = UDATPG_WIDE;
  __s2 = strchr(cldrFieldKey,0x2d);
  if (__s2 != (char *)0x0) {
    lVar4 = 2;
    do {
      lVar3 = lVar4;
      if (lVar3 == 0) goto LAB_002d6aa3;
      iVar1 = strcmp(_ZN6icu_63L16CLDR_FIELD_WIDTHE_rel +
                     *(int *)(_ZN6icu_63L16CLDR_FIELD_WIDTHE_rel + lVar3 * 4),__s2);
      lVar4 = lVar3 + -1;
    } while (iVar1 != 0);
    *widthP = (UDateTimePGDisplayWidth)lVar3;
LAB_002d6aa3:
    *__s2 = '\0';
  }
  lVar4 = 0;
  piVar2 = &_ZN6icu_63L15CLDR_FIELD_NAMEE_rel;
  while( true ) {
    if (lVar4 == 0x10) {
      return UDATPG_FIELD_COUNT;
    }
    iVar1 = strcmp((char *)((long)&_ZN6icu_63L15CLDR_FIELD_NAMEE_rel + (long)*piVar2),cldrFieldKey);
    if (iVar1 == 0) break;
    lVar4 = lVar4 + 1;
    piVar2 = piVar2 + 1;
  }
  return (UDateTimePatternField)lVar4;
}

Assistant:

UDateTimePatternField
DateTimePatternGenerator::getFieldAndWidthIndices(const char* key, UDateTimePGDisplayWidth* widthP) const {
    char cldrFieldKey[UDATPG_FIELD_KEY_MAX + 1];
    uprv_strncpy(cldrFieldKey, key, UDATPG_FIELD_KEY_MAX);
    cldrFieldKey[UDATPG_FIELD_KEY_MAX]=0; // ensure termination
    *widthP = UDATPG_WIDE;
    char* hyphenPtr = uprv_strchr(cldrFieldKey, '-');
    if (hyphenPtr) {
        for (int32_t i=UDATPG_WIDTH_COUNT-1; i>0; --i) {
            if (uprv_strcmp(CLDR_FIELD_WIDTH[i], hyphenPtr)==0) {
                *widthP=(UDateTimePGDisplayWidth)i;
                break;
            }
        }
        *hyphenPtr = 0; // now delete width portion of key
    }
    for (int32_t i=0; i<UDATPG_FIELD_COUNT; ++i ) {
        if (uprv_strcmp(CLDR_FIELD_NAME[i],cldrFieldKey)==0) {
            return (UDateTimePatternField)i;
        }
    }
    return UDATPG_FIELD_COUNT;
}